

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O0

int use_rtc_reference_structure_one_layer(AV1_COMP *cpi)

{
  int iVar1;
  long *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  byte bVar2;
  
  iVar1 = is_one_pass_rt_params
                    ((AV1_COMP *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  bVar2 = 0;
  if (((iVar1 != 0) && (bVar2 = 0, *(int *)(*in_RDI + 0xc75c) == 1)) &&
     (bVar2 = 0, *(int *)(*in_RDI + 0xc758) == 1)) {
    bVar2 = *(int *)(*in_RDI + 0x14dc0) != 0 ^ 0xff;
  }
  return (int)(bVar2 & 1);
}

Assistant:

static inline int use_rtc_reference_structure_one_layer(const AV1_COMP *cpi) {
  return is_one_pass_rt_params(cpi) && cpi->ppi->number_spatial_layers == 1 &&
         cpi->ppi->number_temporal_layers == 1 &&
         !cpi->ppi->rtc_ref.set_ref_frame_config;
}